

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

_Bool upb_inttable_remove(upb_inttable *t,uintptr_t key,upb_value *val)

{
  uint32_t *puVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  uintptr_t uVar4;
  _upb_tabent *p_Var5;
  byte bVar6;
  upb_key uVar7;
  upb_tabent *puVar8;
  _upb_tabent **pp_Var9;
  uint uVar10;
  upb_tabent *move;
  
  if (key < t->array_size) {
    puVar3 = t->presence_mask;
    if ((puVar3[key >> 3] >> ((uint)key & 7) & 1) != 0) {
      t->array_count = t->array_count - 1;
      if (val != (upb_value *)0x0) {
        val->val = t->array[key].val;
      }
      t->array[key].val = 0xffffffffffffffff;
      bVar6 = (byte)key & 7;
      pbVar2 = puVar3 + (key >> 3);
      *pbVar2 = *pbVar2 & (-2 << bVar6 | 0xfeU >> 8 - bVar6);
      return true;
    }
  }
  else {
    uVar10 = ((uint)(key >> 0x20) ^ (uint)key) & (t->t).mask;
    puVar8 = (t->t).entries;
    uVar4 = puVar8[uVar10].key.num;
    if (uVar4 != 0) {
      puVar8 = puVar8 + uVar10;
      if (uVar4 == key) {
        puVar1 = &(t->t).count;
        *puVar1 = *puVar1 - 1;
        if (val != (upb_value *)0x0) {
          val->val = (puVar8->val).val;
        }
        p_Var5 = puVar8->next;
        if (p_Var5 == (_upb_tabent *)0x0) {
          (puVar8->key).num = 0;
        }
        else {
          puVar8->next = p_Var5->next;
          uVar7 = p_Var5->key;
          (puVar8->val).val = (p_Var5->val).val;
          puVar8->key = uVar7;
          (p_Var5->key).num = 0;
        }
      }
      else {
        while( true ) {
          pp_Var9 = &puVar8->next;
          if ((puVar8->next == (_upb_tabent *)0x0) || ((puVar8->next->key).num == key)) break;
          puVar8 = *pp_Var9;
        }
        p_Var5 = *pp_Var9;
        if (p_Var5 == (_upb_tabent *)0x0) {
          return false;
        }
        puVar1 = &(t->t).count;
        *puVar1 = *puVar1 - 1;
        if (val != (upb_value *)0x0) {
          val->val = (p_Var5->val).val;
        }
        (p_Var5->key).num = 0;
        *pp_Var9 = p_Var5->next;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool upb_inttable_remove(upb_inttable* t, uintptr_t key, upb_value* val) {
  bool success;
  if (key < t->array_size) {
    if (upb_inttable_arrhas(t, key)) {
      t->array_count--;
      if (val) {
        *val = t->array[key];
      }
      mutable_array(t)[key] = kInttableSentinel;
      ((uint8_t*)t->presence_mask)[key / 8] &= ~(1 << (key % 8));
      success = true;
    } else {
      success = false;
    }
  } else {
    success = rm(&t->t, intkey(key), val, upb_inthash(key), &inteql);
  }
  check(t);
  return success;
}